

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::StringVector::AddHandle(Vector *vector,BufferHandle *handle)

{
  VectorStringBuffer *pVVar1;
  undefined1 local_38 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  pVVar1 = GetStringBuffer(vector);
  make_shared_ptr<duckdb::ManagedVectorBuffer,duckdb::BufferHandle>((BufferHandle *)local_38);
  local_38._16_8_ = local_38._0_8_;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
  local_38._0_8_ = (element_type *)0x0;
  local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::VectorBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::VectorBuffer,true>>
            ((vector<duckdb::shared_ptr<duckdb::VectorBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,true>>>
              *)&pVVar1->references,(shared_ptr<duckdb::VectorBuffer,_true> *)(local_38 + 0x10));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

void StringVector::AddHandle(Vector &vector, BufferHandle handle) {
	auto &string_buffer = GetStringBuffer(vector);
	string_buffer.AddHeapReference(make_buffer<ManagedVectorBuffer>(std::move(handle)));
}